

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconintra.c
# Opt level: O2

void av1_highbd_dr_prediction_z1_c
               (uint16_t *dst,ptrdiff_t stride,int bw,int bh,uint16_t *above,uint16_t *left,
               int upsample_above,int dx,int dy,int bd)

{
  byte bVar1;
  int iVar2;
  ulong uVar3;
  byte bVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  int iVar11;
  uint16_t uVar12;
  ulong uVar13;
  
  bVar4 = (byte)upsample_above;
  iVar9 = bw + bh + -1 << (bVar4 & 0x1f);
  lVar10 = (long)iVar9;
  iVar6 = 0;
  uVar13 = 0;
  if (0 < bw) {
    uVar13 = (ulong)(uint)bw;
  }
  iVar11 = 0;
  if (0 < bh) {
    iVar11 = bh;
  }
  iVar8 = dx;
  while( true ) {
    if (iVar6 == iVar11) {
      return;
    }
    bVar1 = 6 - bVar4 & 0x1f;
    iVar2 = iVar8 >> bVar1;
    if (iVar9 <= iVar2) break;
    uVar5 = (uint)(iVar8 << (bVar4 & 0x1f)) >> 1 & 0x1f;
    lVar7 = (long)iVar2;
    for (uVar3 = (ulong)(uint)(0 >> bVar1); uVar13 != uVar3; uVar3 = uVar3 + 1) {
      if (lVar7 < lVar10) {
        uVar12 = (uint16_t)
                 ((uint)above[lVar7] * (0x20 - uVar5) + above[lVar7 + 1] * uVar5 + 0x10 >> 5);
      }
      else {
        uVar12 = above[lVar10];
      }
      dst[uVar3] = uVar12;
      lVar7 = lVar7 + (1 << (bVar4 & 0x1f));
    }
    iVar6 = iVar6 + 1;
    iVar8 = iVar8 + dx;
    dst = dst + stride;
  }
  if (bh <= iVar6) {
    bh = iVar6;
  }
  for (; iVar6 != bh; iVar6 = iVar6 + 1) {
    uVar12 = above[lVar10];
    for (lVar7 = 0; bw != lVar7; lVar7 = lVar7 + 1) {
      dst[lVar7] = uVar12;
    }
    dst = dst + stride;
  }
  return;
}

Assistant:

void av1_highbd_dr_prediction_z1_c(uint16_t *dst, ptrdiff_t stride, int bw,
                                   int bh, const uint16_t *above,
                                   const uint16_t *left, int upsample_above,
                                   int dx, int dy, int bd) {
  int r, c, x, base, shift, val;

  (void)left;
  (void)dy;
  (void)bd;
  assert(dy == 1);
  assert(dx > 0);

  const int max_base_x = ((bw + bh) - 1) << upsample_above;
  const int frac_bits = 6 - upsample_above;
  const int base_inc = 1 << upsample_above;
  x = dx;
  for (r = 0; r < bh; ++r, dst += stride, x += dx) {
    base = x >> frac_bits;
    shift = ((x << upsample_above) & 0x3F) >> 1;

    if (base >= max_base_x) {
      for (int i = r; i < bh; ++i) {
        aom_memset16(dst, above[max_base_x], bw);
        dst += stride;
      }
      return;
    }

    for (c = 0; c < bw; ++c, base += base_inc) {
      if (base < max_base_x) {
        val = above[base] * (32 - shift) + above[base + 1] * shift;
        dst[c] = ROUND_POWER_OF_TWO(val, 5);
      } else {
        dst[c] = above[max_base_x];
      }
    }
  }
}